

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O0

Vec_Ptr_t * Cmd_ReadFiles(char *pFileList)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  Gia_Man_t *Entry;
  undefined8 local_420;
  FILE *pFile;
  char pBuffer [1000];
  Vec_Ptr_t *vAigs;
  Gia_Man_t *pGia;
  char *pFileList_local;
  
  local_420 = fopen(pFileList,"rb");
  if (local_420 == (FILE *)0x0) {
    printf("File containing list of files \"%s\" cannot be opened.\n",pFileList);
    pFileList_local = (char *)0x0;
  }
  else {
    pFileList_local = (char *)Vec_PtrAlloc(100);
    while (pcVar2 = fgets((char *)&pFile,1000,local_420), pcVar2 != (char *)0x0) {
      iVar1 = Cmf_IsSpace((char)pFile);
      if ((iVar1 == 0) && ((char)pFile != '#')) {
        while( true ) {
          sVar3 = strlen((char *)&pFile);
          iVar1 = Cmf_IsSpace(*(char *)((long)&local_420 + sVar3 + 7));
          if (iVar1 == 0) break;
          sVar3 = strlen((char *)&pFile);
          *(undefined1 *)((long)&local_420 + sVar3 + 7) = 0;
        }
        Entry = Gia_AigerRead((char *)&pFile,0,0,0);
        if (Entry == (Gia_Man_t *)0x0) {
          printf("Cannot read AIG from file \"%s\".\n",&pFile);
        }
        else {
          Vec_PtrPush((Vec_Ptr_t *)pFileList_local,Entry);
        }
      }
    }
    fclose(local_420);
  }
  return (Vec_Ptr_t *)pFileList_local;
}

Assistant:

Vec_Ptr_t * Cmd_ReadFiles( char * pFileList )
{
    Gia_Man_t * pGia;
    Vec_Ptr_t * vAigs;
    char pBuffer[CMD_AUTO_LINE_MAX];
    FILE * pFile = fopen( pFileList, "rb" );
    if ( pFile == NULL )
        { printf( "File containing list of files \"%s\" cannot be opened.\n", pFileList ); return NULL; }
    vAigs = Vec_PtrAlloc( 100 );
    while ( fgets( pBuffer, CMD_AUTO_LINE_MAX, pFile ) != NULL )
    {
        // get the command from the file
        if ( Cmf_IsSpace(pBuffer[0]) || pBuffer[0] == '#')
            continue;
        // skip trailing spaces
        while ( Cmf_IsSpace(pBuffer[strlen(pBuffer)-1]) )
            pBuffer[strlen(pBuffer)-1] = 0;
        // read the file
        pGia = Gia_AigerRead( pBuffer, 0, 0, 0 );
        if ( pGia == NULL )
        {
            printf( "Cannot read AIG from file \"%s\".\n", pBuffer );
            continue;
        }
        Vec_PtrPush( vAigs, pGia );
    }
    fclose( pFile );
    return vAigs;
}